

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv_disable_stdio_inheritance(void)

{
  int iVar1;
  int set;
  int unaff_retaddr;
  int fd;
  
  set = 0;
  while( true ) {
    iVar1 = uv__cloexec(unaff_retaddr,set);
    if ((iVar1 != 0) && (0xf < set)) break;
    set = set + 1;
  }
  return;
}

Assistant:

void uv_disable_stdio_inheritance(void) {
  int fd;

  /* Set the CLOEXEC flag on all open descriptors. Unconditionally try the
   * first 16 file descriptors. After that, bail out after the first error.
   */
  for (fd = 0; ; fd++)
    if (uv__cloexec(fd, 1) && fd > 15)
      break;
}